

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O1

char * Hello(monst *mtmp)

{
  char *pcVar1;
  
  switch(urole.malenum) {
  case 0x15f:
    return "Salutations";
  case 0x160:
    return "Namaste";
  default:
    return "Hello";
  case 0x165:
    break;
  case 0x166:
    return "Aloha";
  case 0x167:
    return "Velkommen";
  }
  if (mtmp != (monst *)0x0) {
    pcVar1 = "Konnichi wa";
    if (mtmp->data == mons + 0x11a) {
      pcVar1 = "Irasshaimase";
    }
    return pcVar1;
  }
  return "Konnichi wa";
}

Assistant:

const char *Hello(struct monst *mtmp)
{
	switch (Role_switch) {
	case PM_KNIGHT:
	    return "Salutations"; /* Olde English */
	case PM_MONK:
	    return "Namaste";     /* Sanskrit */
	case PM_SAMURAI:
	    return (mtmp && mtmp->data == &mons[PM_SHOPKEEPER] ?
	    		"Irasshaimase" : "Konnichi wa"); /* Japanese */
	case PM_TOURIST:
	    return "Aloha";       /* Hawaiian */
	case PM_VALKYRIE:
	    return "Velkommen";   /* Norse */
	default:
	    return "Hello";
	}
}